

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O3

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBoxDoIt
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId fabarrayid,Box *destFabBox,
          BoxList *returnedUnfilledBoxes,int faindex,int srccomp,int destcomp,int numcomp,
          bool bUseValidBox,BoxDomain *unfilledBoxDomain)

{
  pointer *ppFVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar4;
  int iVar5;
  FabCopyDescriptor<amrex::FArrayBox> *pFVar6;
  long *plVar7;
  undefined8 *puVar8;
  FArrayBox *this_00;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int *piVar20;
  undefined4 uVar21;
  FabArray<amrex::FArrayBox> *this_01;
  iterator __position;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  string __str_1;
  string __str_2;
  string __str;
  Box local_1d8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  long local_1b0;
  int local_1a4;
  ulong *local_1a0;
  long local_198;
  ulong local_190 [2];
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  ulong local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  undefined1 local_d8 [12];
  int iStack_cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  int local_b8;
  int local_b4;
  int local_b0;
  uint local_ac;
  int aiStack_a8 [2];
  int iStack_a0;
  int local_9c;
  int iStack_98;
  int iStack_94;
  IndexType IStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  FabArray<amrex::FArrayBox> *local_68;
  FabArrayCopyDescriptor<amrex::FArrayBox> *local_60;
  BoxList *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  bVar25 = 0;
  local_1b4 = *(int *)(ParallelContext::frames + 0xc);
  lVar19 = (long)fabarrayid.fabArrayId;
  this_01 = (this->fabArrays).
            super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar19];
  local_1d8.smallend.vect._0_8_ = *(undefined8 *)(destFabBox->smallend).vect;
  uVar3 = *(undefined8 *)((destFabBox->smallend).vect + 2);
  local_1d8._20_8_ = *(undefined8 *)((destFabBox->bigend).vect + 2);
  local_1d8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(destFabBox->bigend).vect >> 0x20);
  local_1d8.smallend.vect[2] = (int)uVar3;
  local_1d8.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  local_1a4 = fabarrayid.fabArrayId;
  local_58 = returnedUnfilledBoxes;
  if (bUseValidBox) {
    BATransformer::operator()
              ((Box *)local_d8,&(this_01->super_FabArrayBase).boxarray.m_bat,
               (Box *)((long)faindex * 0x1c +
                      *(long *)(((shared_ptr<amrex::BARef> *)
                                ((long)&(this_01->super_FabArrayBase).boxarray + 0x48))->
                               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              );
  }
  else {
    FabArrayBase::fabbox((Box *)local_d8,&this_01->super_FabArrayBase,faindex);
  }
  iVar9 = local_d8._0_4_;
  if ((int)local_d8._0_4_ < local_1d8.smallend.vect[0]) {
    iVar9 = local_1d8.smallend.vect[0];
  }
  iVar5 = local_d8._4_4_;
  if ((int)local_d8._4_4_ < local_1d8.smallend.vect[1]) {
    iVar5 = local_1d8.smallend.vect[1];
  }
  local_1d8.smallend.vect[1] = iVar5;
  local_1d8.smallend.vect[0] = iVar9;
  iVar15 = local_d8._8_4_;
  if ((int)local_d8._8_4_ < local_1d8.smallend.vect[2]) {
    iVar15 = local_1d8.smallend.vect[2];
  }
  iVar18 = iStack_cc;
  if (local_1d8.bigend.vect[0] < iStack_cc) {
    iVar18 = local_1d8.bigend.vect[0];
  }
  uVar21 = local_c8._M_allocated_capacity._0_4_;
  if (local_1d8.bigend.vect[1] < (int)local_c8._M_allocated_capacity._0_4_) {
    uVar21 = local_1d8.bigend.vect[1];
  }
  uVar2 = local_c8._M_allocated_capacity._4_4_;
  if (local_1d8.bigend.vect[2] < (int)local_c8._M_allocated_capacity._4_4_) {
    uVar2 = local_1d8.bigend.vect[2];
  }
  local_1d8.bigend.vect[2] = uVar2;
  if (iVar18 < iVar9) {
    return;
  }
  if ((int)uVar21 < iVar5) {
    return;
  }
  if ((int)uVar2 < iVar15) {
    return;
  }
  if (7 < local_1d8.btype.itype) {
    return;
  }
  local_1d8.smallend.vect[2] = iVar15;
  local_1d8.bigend.vect[0] = iVar18;
  local_1d8.bigend.vect[1] = uVar21;
  local_1b8 = srccomp;
  pFVar6 = (FabCopyDescriptor<amrex::FArrayBox> *)operator_new(0x48);
  pFVar6->localFabSource = (FArrayBox *)0x0;
  (pFVar6->subBox).smallend.vect[0] = 1;
  (pFVar6->subBox).smallend.vect[1] = 1;
  (pFVar6->subBox).smallend.vect[2] = 1;
  (pFVar6->subBox).bigend = (int  [3])0x0;
  (pFVar6->subBox).btype = 0;
  pFVar6->myProc = -1;
  pFVar6->copyFromProc = -1;
  pFVar6->copyFromIndex = -1;
  pFVar6->fillBoxId = -1;
  pFVar6->fillBoxId = -1;
  pFVar6->srcComp = -1;
  pFVar6->destComp = -1;
  pFVar6->nComp = -1;
  pFVar6->fillType = Unfillable;
  pFVar6->cacheDataAllocated = false;
  uVar17 = *(uint *)(*(long *)*(long *)&(this_01->super_FabArrayBase).distributionMap.m_ref.
                                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                    + (long)faindex * 4);
  local_1bc = faindex;
  local_1b0 = lVar19;
  if ((int)uVar17 < *(int *)(ParallelContext::frames + 0x10)) goto LAB_00378fe1;
  uVar24 = *(uint *)(ParallelContext::frames + 0xc);
  uVar23 = -uVar24;
  if (0 < (int)uVar24) {
    uVar23 = uVar24;
  }
  uVar22 = 1;
  if (9 < uVar23) {
    uVar16 = (ulong)uVar23;
    uVar11 = 4;
    do {
      uVar22 = uVar11;
      uVar10 = (uint)uVar16;
      if (uVar10 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_00378a07;
      }
      if (uVar10 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_00378a07;
      }
      if (uVar10 < 10000) goto LAB_00378a07;
      uVar16 = uVar16 / 10000;
      uVar11 = uVar22 + 4;
    } while (99999 < uVar10);
    uVar22 = uVar22 + 1;
  }
LAB_00378a07:
  local_50[0] = local_40;
  local_100 = (ulong)uVar17;
  local_68 = this_01;
  local_60 = this;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar22 - (char)((int)uVar24 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar24 >> 0x1f)),uVar22,uVar23);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x760ee5);
  lVar19 = local_1b0;
  local_88 = &local_78;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_78 = *plVar12;
    lStack_70 = plVar7[3];
  }
  else {
    local_78 = *plVar12;
    local_88 = (long *)*plVar7;
  }
  local_80 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_170 = *puVar13;
    lStack_168 = plVar7[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar13;
    local_180 = (ulong *)*plVar7;
  }
  local_178 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar17 = *(uint *)(ParallelContext::frames + 0x10);
  uVar24 = -uVar17;
  if (0 < (int)uVar17) {
    uVar24 = uVar17;
  }
  uVar23 = 1;
  if (9 < uVar24) {
    uVar16 = (ulong)uVar24;
    uVar22 = 4;
    do {
      uVar23 = uVar22;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar23 = uVar23 - 2;
        goto LAB_00378b87;
      }
      if (uVar11 < 1000) {
        uVar23 = uVar23 - 1;
        goto LAB_00378b87;
      }
      if (uVar11 < 10000) goto LAB_00378b87;
      uVar16 = uVar16 / 10000;
      uVar22 = uVar23 + 4;
    } while (99999 < uVar11);
    uVar23 = uVar23 + 1;
  }
LAB_00378b87:
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,(char)uVar23 - (char)((int)uVar17 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar17 >> 0x1f) + (long)local_1a0),uVar23,uVar24);
  uVar16 = 0xf;
  if (local_180 != &local_170) {
    uVar16 = local_170;
  }
  if (uVar16 < (ulong)(local_198 + local_178)) {
    uVar16 = 0xf;
    if (local_1a0 != local_190) {
      uVar16 = local_190[0];
    }
    if (uVar16 < (ulong)(local_198 + local_178)) goto LAB_00378bfe;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_00378bfe:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0);
  }
  local_140 = &local_130;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_130 = *plVar7;
    uStack_128 = puVar8[3];
  }
  else {
    local_130 = *plVar7;
    local_140 = (long *)*puVar8;
  }
  local_138 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_e8 = *puVar13;
    lStack_e0 = plVar7[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar13;
    local_f8 = (ulong *)*plVar7;
  }
  local_f0 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar24 = (uint)local_100;
  uVar17 = -uVar24;
  if (0 < (int)uVar24) {
    uVar17 = uVar24;
  }
  uVar24 = 1;
  if (9 < uVar17) {
    uVar16 = (ulong)uVar17;
    uVar23 = 4;
    do {
      uVar24 = uVar23;
      uVar22 = (uint)uVar16;
      if (uVar22 < 100) {
        uVar24 = uVar24 - 2;
        goto LAB_00378d3f;
      }
      if (uVar22 < 1000) {
        uVar24 = uVar24 - 1;
        goto LAB_00378d3f;
      }
      if (uVar22 < 10000) goto LAB_00378d3f;
      uVar16 = uVar16 / 10000;
      uVar23 = uVar24 + 4;
    } while (99999 < uVar22);
    uVar24 = uVar24 + 1;
  }
LAB_00378d3f:
  uVar16 = local_100 >> 0x1f & 1;
  local_160 = local_150;
  std::__cxx11::string::_M_construct((ulong)&local_160,(char)uVar24 + (char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)(uVar16 + (long)local_160),uVar24,uVar17);
  uVar16 = 0xf;
  if (local_f8 != &local_e8) {
    uVar16 = local_e8;
  }
  if (uVar16 < (ulong)(local_158 + local_f0)) {
    uVar16 = 0xf;
    if (local_160 != local_150) {
      uVar16 = local_150[0];
    }
    if (uVar16 < (ulong)(local_158 + local_f0)) goto LAB_00378dce;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_00378dce:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_160);
  }
  local_120 = &local_110;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_110 = *plVar7;
    uStack_108 = puVar8[3];
  }
  else {
    local_110 = *plVar7;
    local_120 = (long *)*puVar8;
  }
  local_118 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar14) {
    local_c8 = *paVar14;
    local_d8._0_8_ = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  stack0xffffffffffffff30 = (FabCopyDescriptor<amrex::FArrayBox> *)plVar7[1];
  *plVar7 = (long)paVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Abort((string *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
  }
  this = local_60;
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  uVar17 = (uint)local_100;
  this_01 = local_68;
LAB_00378fe1:
  iVar9 = this->nextFillBoxId;
  pFVar6->fillBoxId = iVar9;
  *(ulong *)(pFVar6->subBox).bigend.vect =
       CONCAT44(local_1d8.bigend.vect[1],local_1d8.bigend.vect[0]);
  *(undefined8 *)((pFVar6->subBox).bigend.vect + 2) = local_1d8._20_8_;
  *(undefined8 *)(pFVar6->subBox).smallend.vect = local_1d8.smallend.vect._0_8_;
  *(ulong *)((pFVar6->subBox).smallend.vect + 2) =
       CONCAT44(local_1d8.bigend.vect[0],local_1d8.smallend.vect[2]);
  pFVar6->myProc = local_1b4;
  pFVar6->copyFromProc = uVar17;
  pFVar6->copyFromIndex = local_1bc;
  pFVar6->srcComp = local_1b8;
  pFVar6->destComp = destcomp;
  pFVar6->nComp = numcomp;
  if ((int)uVar17 < 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = uVar17 - (int)uVar17 % (int)ParallelDescriptor::m_Team._4_4_;
  }
  if (ParallelDescriptor::m_Team._12_4_ == iVar5) {
    pFVar6->fillType = FillLocally;
    iVar5 = FabArrayBase::localindex(&this_01->super_FabArrayBase,local_1bc);
    pFVar6->localFabSource =
         *(FArrayBox **)
          (*(long *)&(this_01->m_fabs_v).
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl + (long)iVar5 * 8);
  }
  else {
    local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )0x0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    stack0xffffffffffffff30 = (FabCopyDescriptor<amrex::FArrayBox> *)0x0;
    this->dataAvailable = false;
    pFVar6->fillType = FillRemotely;
    this_00 = (FArrayBox *)operator_new(0x48);
    FArrayBox::FArrayBox(this_00,&local_1d8,numcomp,true,false,(Arena *)0x0);
    aVar4 = local_c8;
    pFVar6->localFabSource = this_00;
    pFVar6->cacheDataAllocated = true;
    local_b8 = local_1a4;
    local_b4 = this->nextFillBoxId;
    local_d8._8_4_ = local_1bc;
    local_b0 = local_1b4;
    local_ac = uVar17;
    iStack_98 = local_1d8.bigend.vect[1];
    iStack_94 = local_1d8.bigend.vect[2];
    IStack_90.itype = local_1d8.btype.itype;
    aiStack_a8[0] = local_1d8.smallend.vect[0];
    aiStack_a8[1] = local_1d8.smallend.vect[1];
    iStack_a0 = local_1d8.smallend.vect[2];
    local_9c = local_1d8.bigend.vect[0];
    local_c8._M_allocated_capacity._4_4_ = destcomp;
    local_c8._M_allocated_capacity._0_4_ = local_1b8;
    local_c8._12_4_ = aVar4._12_4_;
    local_c8._8_4_ = numcomp;
    __position._M_current =
         (this->fabComTagList).
         super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->fabComTagList).
        super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<amrex::FabArrayBase::FabComTag,std::allocator<amrex::FabArrayBase::FabComTag>>::
      _M_realloc_insert<amrex::FabArrayBase::FabComTag_const&>
                ((vector<amrex::FabArrayBase::FabComTag,std::allocator<amrex::FabArrayBase::FabComTag>>
                  *)&this->fabComTagList,__position,(FabComTag *)local_d8);
      lVar19 = local_1b0;
    }
    else {
      piVar20 = (int *)local_d8;
      for (lVar19 = 0x13; lVar19 != 0; lVar19 = lVar19 + -1) {
        (__position._M_current)->fromProc = *piVar20;
        piVar20 = piVar20 + (ulong)bVar25 * -2 + 1;
        __position._M_current = __position._M_current + (ulong)bVar25 * -8 + 4;
      }
      ppFVar1 = &(this->fabComTagList).
                 super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar1 = *ppFVar1 + 1;
      lVar19 = local_1b0;
    }
  }
  local_d8._0_4_ = iVar9;
  stack0xffffffffffffff30 = pFVar6;
  std::
  _Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
  ::_M_insert_equal<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>
            ((_Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
              *)((this->fabCopyDescList).
                 super__Vector_base<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar19),
             (pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*> *)local_d8);
  if (local_58 != (BoxList *)0x0) {
    BoxDomain::rmBox(unfilledBoxDomain,&local_1d8);
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::AddBoxDoIt (FabArrayId fabarrayid,
                                         const Box& destFabBox,
                                         BoxList*   returnedUnfilledBoxes,
                                         int        faindex,
                                         int        srccomp,
                                         int        destcomp,
                                         int        numcomp,
                                         bool       bUseValidBox,
                                         BoxDomain& unfilledBoxDomain)
{
    const int myProc = ParallelDescriptor::MyProc();

    FabArray<FAB>* fabArray = fabArrays[fabarrayid.Id()];

    BL_ASSERT(faindex >= 0 && faindex < fabArray->size());

    Box intersect = destFabBox;

    if (bUseValidBox)
    {
        intersect &= fabArray->box(faindex);
    }
    else
    {
        intersect &= fabArray->fabbox(faindex);
    }

    if (intersect.ok())
    {
        FabCopyDescriptor<FAB>* fcd = new FabCopyDescriptor<FAB>;

        int remoteProc     = fabArray->DistributionMap()[faindex];
        if(remoteProc >= ParallelDescriptor::NProcs()) {
            amrex::Abort("Bad remoteProc: "
                         + std::to_string(ParallelDescriptor::MyProc())
                         + ":: _in AddBoxDoIt:  nProcs remoteProc = "
                         + std::to_string(ParallelDescriptor::NProcs())
                         + "  " + std::to_string(remoteProc) + "\n");
        }
        fcd->fillBoxId     = nextFillBoxId;
        fcd->subBox        = intersect;
        fcd->myProc        = myProc;
        fcd->copyFromProc  = remoteProc;
        fcd->copyFromIndex = faindex;
        fcd->srcComp       = srccomp;
        fcd->destComp      = destcomp;
        fcd->nComp         = numcomp;

        if (ParallelDescriptor::sameTeam(remoteProc))
        {
            //
            // Data is local.
            //
            fcd->fillType       = FillLocally;
            fcd->localFabSource = &(*fabArray)[faindex];
        }
        else
        {
            //
            // Data is remote.
            //
            FabArrayBase::FabComTag fabComTag;

            dataAvailable               = false;
            fcd->fillType               = FillRemotely;
            fcd->localFabSource         = new FAB(intersect, numcomp);
            fcd->cacheDataAllocated     = true;
            fabComTag.fabArrayId        = fabarrayid.Id();
            fabComTag.fillBoxId         = nextFillBoxId;
            fabComTag.fabIndex          = faindex;
            fabComTag.procThatNeedsData = myProc;
            fabComTag.procThatHasData   = remoteProc;
            fabComTag.box               = intersect;
            fabComTag.srcComp           = srccomp;
            fabComTag.destComp          = destcomp;
            fabComTag.nComp             = numcomp;
            //
            // Do not send the data yet.
            //
            fabComTagList.push_back(fabComTag);
        }

        fabCopyDescList[fabarrayid.Id()].insert(FCDMapValueType(fcd->fillBoxId,fcd));

        if (returnedUnfilledBoxes != 0)
        {
            unfilledBoxDomain.rmBox(intersect);
        }
    }
}